

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O0

Vec<Hpipe::BranchSet::Range> * __thiscall
Hpipe::Vec<Hpipe::BranchSet::Range>::from
          (Vec<Hpipe::BranchSet::Range> *__return_storage_ptr__,Vec<Hpipe::BranchSet::Range> *this,
          uint beg)

{
  size_type sVar1;
  Range *val;
  undefined4 local_30;
  uint i;
  uint beg_local;
  Vec<Hpipe::BranchSet::Range> *this_local;
  Vec<Hpipe::BranchSet::Range> *res;
  
  Vec(__return_storage_ptr__);
  sVar1 = std::vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>::size
                    (&this->
                      super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                    );
  std::vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>::reserve
            (&__return_storage_ptr__->
              super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>,
             sVar1 - beg);
  for (local_30 = beg;
      sVar1 = std::vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>::size
                        (&this->
                          super_vector<Hpipe::BranchSet::Range,_std::allocator<Hpipe::BranchSet::Range>_>
                        ), local_30 < sVar1; local_30 = local_30 + 1) {
    val = operator[](this,local_30);
    operator<<(__return_storage_ptr__,val);
  }
  return __return_storage_ptr__;
}

Assistant:

Vec      from                 ( unsigned beg               ) const { Vec res; res.reserve( this->size() - beg ); for( unsigned i = beg; i < this->size(); ++i ) res << this->operator[]( i ); return res; }